

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-decompress.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *__stream;
  FILE *__stream_00;
  uint uVar1;
  char *__filename;
  KosinskiDecompressCallbacks callbacks;
  KosinskiDecompressCallbacks local_40;
  
  if (argc < 2) {
    fputs("This tool decompresses a supplied file that\'s in the Kosinski format.\n\nwww.github.com/Clownacy/accurate-kosinski\n\nUsage: kosinski-decompress [in_file] [out_file](optional)\n"
          ,_stdout);
    uVar1 = 0;
  }
  else {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      main_cold_1();
      uVar1 = 1;
    }
    else {
      if (argc == 2) {
        __filename = "out.unc";
      }
      else {
        __filename = argv[2];
      }
      __stream_00 = fopen(__filename,"wb");
      if (__stream_00 == (FILE *)0x0) {
        fprintf(_stderr,"Could not open \'%s\'\n",__filename);
      }
      else {
        local_40.read_byte = ReadByte;
        local_40.write_byte = WriteByte;
        local_40.read_byte_user_data = __stream;
        local_40.write_byte_user_data = __stream_00;
        KosinskiDecompress(&local_40,'\0');
        fclose(__stream_00);
      }
      uVar1 = (uint)(__stream_00 == (FILE *)0x0);
      fclose(__stream);
    }
  }
  return uVar1;
}

Assistant:

int main(const int argc, char** const argv)
{
	int exit_code = EXIT_SUCCESS;

	if (argc < 2)
	{
		fputs(
			"This tool decompresses a supplied file that's in the Kosinski format.\n"
			"\n"
			"www.github.com/Clownacy/accurate-kosinski\n"
			"\n"
			"Usage: kosinski-decompress [in_file] [out_file](optional)\n"
			, stdout
		);
	}
	else
	{
		FILE* const in_file = fopen(argv[1], "rb");

		if (in_file == NULL)
		{
			exit_code = EXIT_FAILURE;
			fprintf(stderr, "Could not open '%s'\n", argv[1]);
		}
		else
		{
			const char* const out_filename = (argc > 2) ? argv[2] : "out.unc";

			FILE* const out_file = fopen(out_filename, "wb");

			if (out_file == NULL)
			{
				exit_code = EXIT_FAILURE;
				fprintf(stderr, "Could not open '%s'\n", out_filename);
			}
			else
			{
				KosinskiDecompressCallbacks callbacks;
				callbacks.read_byte_user_data = in_file;
				callbacks.read_byte = ReadByte;
				callbacks.write_byte_user_data = out_file;
				callbacks.write_byte = WriteByte;

				KosinskiDecompress(&callbacks,
				#ifdef DEBUG
					cc_true
				#else
					cc_false
				#endif
				);

				fclose(out_file);
			}

			fclose(in_file);
		}
	}

	return exit_code;
}